

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFlatImageIO.cpp
# Opt level: O0

void Imf_2_5::loadFlatImage(string *fileName,Header *hdr,FlatImage *img)

{
  bool bVar1;
  ostream *poVar2;
  ArgExc *pAVar3;
  string *in_RDI;
  stringstream _iex_throw_s_2;
  stringstream _iex_throw_s_1;
  stringstream _iex_throw_s;
  bool multiPart;
  bool deep;
  bool tiled;
  bool *in_stack_fffffffffffffb30;
  bool *in_stack_fffffffffffffb38;
  bool *in_stack_fffffffffffffb40;
  char *in_stack_fffffffffffffb48;
  FlatImage *in_stack_fffffffffffffc50;
  Header *in_stack_fffffffffffffc58;
  string *in_stack_fffffffffffffc60;
  stringstream local_340 [16];
  ostream local_330 [16];
  FlatImage *in_stack_fffffffffffffce0;
  Header *in_stack_fffffffffffffce8;
  string *in_stack_fffffffffffffcf0;
  stringstream local_1a8 [16];
  ostream local_198 [381];
  byte local_1b;
  byte local_1a;
  byte local_19;
  string *local_8;
  
  local_8 = in_RDI;
  std::__cxx11::string::c_str();
  bVar1 = isOpenExrFile(in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,
                        in_stack_fffffffffffffb38,in_stack_fffffffffffffb30);
  if (!bVar1) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1a8);
    poVar2 = std::operator<<(local_198,"Cannot load image file ");
    poVar2 = std::operator<<(poVar2,local_8);
    std::operator<<(poVar2,".  The file is not an OpenEXR file.");
    pAVar3 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar3,local_1a8);
    __cxa_throw(pAVar3,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  if ((local_1b & 1) != 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_340);
    poVar2 = std::operator<<(local_330,"Cannot load image file ");
    poVar2 = std::operator<<(poVar2,local_8);
    std::operator<<(poVar2,".  Multi-part file loading is not supported.");
    pAVar3 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar3,local_340);
    __cxa_throw(pAVar3,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  if ((local_1a & 1) != 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffb38);
    poVar2 = std::operator<<((ostream *)&stack0xfffffffffffffb48,"Cannot load deep image file ");
    poVar2 = std::operator<<(poVar2,local_8);
    std::operator<<(poVar2," as a flat image.");
    pAVar3 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar3,(stringstream *)&stack0xfffffffffffffb38);
    __cxa_throw(pAVar3,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  if ((local_19 & 1) == 0) {
    loadFlatScanLineImage
              (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
  }
  else {
    loadFlatTiledImage(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,in_stack_fffffffffffffc50
                      );
  }
  return;
}

Assistant:

void
loadFlatImage
    (const string &fileName,
     Header &hdr,
     FlatImage &img)
{
    bool tiled, deep, multiPart;

    if (!isOpenExrFile (fileName.c_str(), tiled, deep, multiPart))
    {
        THROW (ArgExc, "Cannot load image file " << fileName << ".  "
                       "The file is not an OpenEXR file.");
    }

    if (multiPart)
    {
        THROW (ArgExc, "Cannot load image file " << fileName << ".  "
                       "Multi-part file loading is not supported.");
    }

    if (deep)
    {
        THROW (ArgExc, "Cannot load deep image file " << fileName << " "
                       "as a flat image.");
    }

    if (tiled)
        loadFlatTiledImage (fileName, hdr, img);
    else
        loadFlatScanLineImage (fileName, hdr, img);
}